

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  size_t sVar2;
  uint in_stack_00000020;
  ZSTD_CCtx_params initialParams;
  undefined1 in_stack_ffffffffffffff34 [24];
  
  cParams_00._4_24_ = in_stack_ffffffffffffff34;
  cParams_00.windowLog = in_stack_00000020;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  if (in_stack_00000020 - 6 < 0xfffffffd) {
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff40);
  }
  else {
    sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff40);
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff40);
    if (sVar1 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
        noRowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_urm_enableRowMatchFinder;
        rowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
    }
}